

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zap.c
# Opt level: O1

void makewish(boolean magical)

{
  bool bVar1;
  char cVar2;
  boolean bVar3;
  uint uVar4;
  obj *poVar5;
  long lVar6;
  char *pcVar7;
  obj *poVar8;
  int iVar9;
  byte bVar10;
  int iVar11;
  char *drop_fmt;
  obj nothing;
  char buf [256];
  char origbuf [256];
  obj local_2a0;
  short local_238 [128];
  char local_138 [264];
  
  poVar5 = &zeroobj;
  poVar8 = &local_2a0;
  for (lVar6 = 0xd; lVar6 != 0; lVar6 = lVar6 + -1) {
    poVar8->nobj = poVar5->nobj;
    poVar5 = (obj *)&poVar5->v;
    poVar8 = (obj *)&poVar8->v;
  }
  if (flags.verbose != '\0') {
    pline("You may wish for an object.");
  }
  iVar9 = 0;
LAB_00292cbc:
  do {
    getlin("For what do you wish?",(char *)local_238);
    cVar2 = (char)local_238[0];
  } while ((char)local_238[0] == '\x1b');
  strcpy(local_138,(char *)local_238);
  if (cVar2 == '\0' && magical == '\0') {
    uVar4 = mt_random();
    local_238[0] = (ushort)((uVar4 & 1) == 0) * 4 + 0x25;
  }
  poVar5 = readobjnam((char *)local_238,&local_2a0,'\x01');
  if (poVar5 == (obj *)0x0) goto LAB_00292d24;
  iVar11 = iVar9;
  if (poVar5 == &local_2a0) {
    historic_event('\0',"refused a wish.");
    return;
  }
  goto LAB_00292d6e;
LAB_00292d24:
  pline("Nothing fitting that description exists in the game.");
  iVar11 = iVar9 + 1;
  bVar1 = 3 < iVar9;
  iVar9 = iVar11;
  if (bVar1) {
    pline("That\'s enough tries!");
    poVar5 = readobjnam((char *)0x0,(obj *)0x0,'\x01');
    if (poVar5 == (obj *)0x0) {
      return;
    }
LAB_00292d6e:
    bVar10 = 1;
    if ((poVar5->oartifact == '\0') && (poVar5->oprops == 0)) {
      bVar10 = (objects[poVar5->otyp].field_0x10 & 0x10) >> 4;
    }
    if ((magical != '\0') || (bVar10 == 0)) {
      historic_event('\0',"wished for \"%s\".",local_138);
      if (bVar10 != 0) {
        u.uconduct.wishmagic = u.uconduct.wishmagic + 1;
      }
      u.uconduct.wishes = u.uconduct.wishes + 1;
      if (poVar5 != &zeroobj) {
        examine_object(poVar5);
        if ((u._1052_1_ & 1) == 0) {
          bVar3 = on_level(&u.uz,&dungeon_topology.d_air_level);
          drop_fmt = "Oops!  %s away from you!";
          if ((((bVar3 == '\0') &&
               (bVar3 = on_level(&u.uz,&dungeon_topology.d_water_level), bVar3 == '\0')) &&
              (bVar10 = level->locations[u.ux][u.uy].typ, '\x15' < (char)bVar10)) &&
             (drop_fmt = "Oops!  %s to the floor!", 0x21 < bVar10)) {
            drop_fmt = "Oops!  %s away from you!";
          }
        }
        else {
          drop_fmt = "Oops!  %s out of your reach!";
        }
        bVar3 = on_level(&u.uz,&dungeon_topology.d_air_level);
        pcVar7 = "slip";
        if ((u._1052_1_ & 2) == 0 && bVar3 == '\0') {
          pcVar7 = "drop";
        }
        pcVar7 = aobjnam(poVar5,pcVar7);
        pcVar7 = The(pcVar7);
        hold_another_object(poVar5,drop_fmt,pcVar7,(char *)0x0);
      }
      return;
    }
    verbalize("I am sorry, but I am unable to provide you with magical items.");
    if (poVar5->oartifact != '\0') {
      artifact_exists(poVar5,(char *)((long)poVar5->oextra + (long)poVar5->oxlth),'\0');
    }
    obfree(poVar5,(obj *)0x0);
    iVar9 = iVar11;
  }
  goto LAB_00292cbc;
}

Assistant:

void makewish(boolean magical)
{
	char buf[BUFSZ], origbuf[BUFSZ];
	struct obj *otmp, nothing;
	int tries = 0;
	boolean magical_object;

	nothing = zeroobj;  /* lint suppression; only its address matters */
	if (flags.verbose) pline("You may wish for an object.");
 retry:
	do {
	    getlin("For what do you wish?", buf);
	} while (buf[0] == '\033'); /* prevent accidental cancelling of a wish */
	strcpy(origbuf, buf);

	/*
	 *  WORKAROUND: Wishing for a random non-magical item is not easily done
	 *              with the current code.
	 *              For the time being select FOOD or WEAPON class as those
	 *              are the only classes without any magical items in them.
	 */
	if (!magical && buf[0] == 0)
	    strcpy(buf, rn2(2) ? "%" : ")");

	/*
	 *  Note: if they wished for and got a non-object successfully,
	 *  otmp == &zeroobj.  That includes gold, or an artifact that
	 *  has been denied.  Wishing for "nothing" requires a separate
	 *  value to remain distinct.
	 */
	otmp = readobjnam(buf, &nothing, TRUE);
	if (!otmp) {
	    pline("Nothing fitting that description exists in the game.");
	    if (++tries < 5) goto retry;
	    pline("That's enough tries!");
	    otmp = readobjnam(NULL, NULL, TRUE);
	    if (!otmp) return;	/* for safety; should never happen */
	} else if (otmp == &nothing) {
	    historic_event(FALSE, "refused a wish.");
	    /* explicitly wished for "nothing", presumeably attempting
	       to retain wishless conduct */
	    return;
	}

	/* Check if wishing for magical objects is allowed. */
	magical_object = otmp && (otmp->oartifact || otmp->oprops ||
				  objects[otmp->otyp].oc_magic);
	if (!magical && magical_object) {
	    verbalize("I am sorry, but I am unable to provide you with magical items.");
	    if (otmp->oartifact) artifact_exists(otmp, ONAME(otmp), FALSE);
	    obfree(otmp, NULL);
	    otmp = &zeroobj;
	    goto retry;
	} else {
	    historic_event(FALSE, "wished for \"%s\".", origbuf);
	}

	if (magical_object)
	    u.uconduct.wishmagic++;

	/* KMH, conduct */
	u.uconduct.wishes++;

	if (otmp != &zeroobj) {
	    examine_object(otmp);
	    /* The(aobjnam()) is safe since otmp is unidentified -dlc */
	    hold_another_object(otmp, u.uswallow ?
				       "Oops!  %s out of your reach!" :
				       (Is_airlevel(&u.uz) ||
					Is_waterlevel(&u.uz) ||
					level->locations[u.ux][u.uy].typ < IRONBARS ||
					level->locations[u.ux][u.uy].typ >= ICE) ?
				       "Oops!  %s away from you!" :
				       "Oops!  %s to the floor!",
				       The(aobjnam(otmp,
					     Is_airlevel(&u.uz) || u.uinwater ?
						   "slip" : "drop")),
				       NULL);
	}
}